

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_sig_alg_gets
              (char *buf,size_t size,mbedtls_x509_buf *sig_oid,mbedtls_pk_type_t pk_alg,
              mbedtls_md_type_t md_alg,void *sig_opts)

{
  char *local_58;
  char *desc;
  size_t n;
  char *p;
  void *pvStack_38;
  int ret;
  void *sig_opts_local;
  mbedtls_md_type_t md_alg_local;
  mbedtls_pk_type_t pk_alg_local;
  mbedtls_x509_buf *sig_oid_local;
  size_t size_local;
  char *buf_local;
  
  p._4_4_ = 0xffffff92;
  local_58 = (char *)0x0;
  desc = (char *)size;
  n = (size_t)buf;
  pvStack_38 = sig_opts;
  sig_opts_local._0_4_ = md_alg;
  sig_opts_local._4_4_ = pk_alg;
  _md_alg_local = sig_oid;
  sig_oid_local = (mbedtls_x509_buf *)size;
  size_local = (size_t)buf;
  p._4_4_ = mbedtls_oid_get_sig_alg_desc(sig_oid,&local_58);
  if (p._4_4_ == 0) {
    p._4_4_ = snprintf((char *)n,(size_t)desc,"%s",local_58);
  }
  else {
    p._4_4_ = snprintf((char *)n,(size_t)desc,"???");
  }
  if ((p._4_4_ < 0) || (desc <= (char *)(long)p._4_4_)) {
    buf_local._4_4_ = -0x2980;
  }
  else {
    buf_local._4_4_ = (int)sig_oid_local - ((int)desc - p._4_4_);
  }
  return buf_local._4_4_;
}

Assistant:

int mbedtls_x509_sig_alg_gets(char *buf, size_t size, const mbedtls_x509_buf *sig_oid,
                              mbedtls_pk_type_t pk_alg, mbedtls_md_type_t md_alg,
                              const void *sig_opts)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    char *p = buf;
    size_t n = size;
    const char *desc = NULL;

    ret = mbedtls_oid_get_sig_alg_desc(sig_oid, &desc);
    if (ret != 0) {
        ret = mbedtls_snprintf(p, n, "???");
    } else {
        ret = mbedtls_snprintf(p, n, "%s", desc);
    }
    MBEDTLS_X509_SAFE_SNPRINTF;

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
    if (pk_alg == MBEDTLS_PK_RSASSA_PSS) {
        const mbedtls_pk_rsassa_pss_options *pss_opts;

        pss_opts = (const mbedtls_pk_rsassa_pss_options *) sig_opts;

        const char *name = md_type_to_string(md_alg);
        const char *mgf_name = md_type_to_string(pss_opts->mgf1_hash_id);

        ret = mbedtls_snprintf(p, n, " (%s, MGF1-%s, 0x%02X)",
                               name ? name : "???",
                               mgf_name ? mgf_name : "???",
                               (unsigned int) pss_opts->expected_salt_len);
        MBEDTLS_X509_SAFE_SNPRINTF;
    }
#else
    ((void) pk_alg);
    ((void) md_alg);
    ((void) sig_opts);
#endif /* MBEDTLS_X509_RSASSA_PSS_SUPPORT */

    return (int) (size - n);
}